

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestsList
               (ostream *stream,
               vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *test_cases)

{
  pointer ppTVar1;
  TestCase *pTVar2;
  ostream *poVar3;
  long lVar4;
  size_t i_1;
  ulong uVar5;
  string kTestsuites;
  allocator<char> local_7e;
  allocator<char> local_7d;
  int local_7c;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"testsuites",(allocator<char> *)&local_78);
  std::operator<<(stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar3 = std::operator<<(stream,"<");
  std::operator<<(poVar3,(string *)&local_38);
  ppTVar1 = (test_cases->
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_7c = 0;
  for (lVar4 = 0;
      (long)(test_cases->
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3 != lVar4; lVar4 = lVar4 + 1) {
    pTVar2 = ppTVar1[lVar4];
    local_7c = local_7c +
               (int)((ulong)((long)*(pointer *)
                                    ((long)&(pTVar2->test_info_list_).
                                            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                            ._M_impl + 8) -
                            *(long *)&(pTVar2->test_info_list_).
                                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                      ._M_impl.super__Vector_impl_data) >> 3);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"tests",&local_7e);
  StreamableToString<int>(&local_58,&local_7c);
  OutputXmlAttribute(stream,&local_38,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"name",&local_7e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"AllTests",&local_7d);
  OutputXmlAttribute(stream,&local_38,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::operator<<(stream,">\n");
  for (uVar5 = 0;
      ppTVar1 = (test_cases->
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(test_cases->
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3);
      uVar5 = uVar5 + 1) {
    PrintXmlTestCase(stream,ppTVar1[uVar5]);
  }
  poVar3 = std::operator<<(stream,"</");
  poVar3 = std::operator<<(poVar3,(string *)&local_38);
  std::operator<<(poVar3,">\n");
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestsList(
    std::ostream* stream, const std::vector<TestCase*>& test_cases) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  int total_tests = 0;
  for (size_t i = 0; i < test_cases.size(); ++i) {
    total_tests += test_cases[i]->total_test_count();
  }
  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(total_tests));
  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (size_t i = 0; i < test_cases.size(); ++i) {
    PrintXmlTestCase(stream, *test_cases[i]);
  }
  *stream << "</" << kTestsuites << ">\n";
}